

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenKeyGetter_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,StructDef *struct_def,
          FieldDef *key_field)

{
  allocator<char> local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"builder.DataBuffer",&local_121);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"builder.DataBuffer.Length - o1.Value",&local_122);
  GenGetterForLookupByKey(&local_80,this,struct_def,key_field,&local_a0,&local_c0);
  std::operator+(&local_60,&local_80,".CompareTo(");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"builder.DataBuffer",&local_123);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"builder.DataBuffer.Length - o2.Value",&local_124);
  GenGetterForLookupByKey(&local_e0,this,struct_def,key_field,&local_100,&local_120);
  std::operator+(&local_40,&local_60,&local_e0);
  std::operator+(__return_storage_ptr__,&local_40,")");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenKeyGetter(flatbuffers::StructDef &struct_def,
                           flatbuffers::FieldDef *key_field) const {
    // Get the getter for the key of the struct.
    return GenGetterForLookupByKey(struct_def, key_field, "builder.DataBuffer",
                                   "builder.DataBuffer.Length - o1.Value") +
           ".CompareTo(" +
           GenGetterForLookupByKey(struct_def, key_field, "builder.DataBuffer",
                                   "builder.DataBuffer.Length - o2.Value") +
           ")";
  }